

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O2

void __thiscall
ExprWriterTest_NotExprPrecedence_Test::TestBody(ExprWriterTest_NotExprPrecedence_Test *this)

{
  ExprBase rhs;
  NumericConstant then_expr;
  Reference lhs;
  BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
  arg;
  NotExpr NVar1;
  ExprFactory *this_00;
  char *message;
  AssertHelper local_50;
  AssertionResult gtest_ar;
  string local_38;
  
  this_00 = &(this->super_ExprWriterTest).super_ExprFactory;
  rhs.impl_ = (Impl *)mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant(this_00,0.0);
  then_expr = mp::BasicExprFactory<std::allocator<char>_>::MakeNumericConstant(this_00,1.0);
  lhs = mp::BasicExprFactory<std::allocator<char>_>::MakeVariable(this_00,0);
  arg = mp::BasicExprFactory<std::allocator<char>>::
        MakeBinary<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                  ((BasicExprFactory<std::allocator<char>> *)this_00,EQ,
                   (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)
                   lhs.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_,
                   (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)rhs.impl_);
  NVar1 = mp::BasicExprFactory<std::allocator<char>_>::MakeNot
                    (this_00,(LogicalExpr)
                             arg.super_BasicExpr<(mp::expr::Kind)53,_(mp::expr::Kind)58>.
                             super_ExprBase.impl_);
  NVar1 = mp::BasicExprFactory<std::allocator<char>_>::MakeNot
                    (this_00,(LogicalExpr)
                             NVar1.super_BasicExpr<(mp::expr::Kind)49,_(mp::expr::Kind)49>.
                             super_ExprBase.impl_);
  local_50.data_ =
       (AssertHelperData *)
       mp::BasicExprFactory<std::allocator<char>>::
       MakeIf<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                 ((BasicExprFactory<std::allocator<char>> *)this_00,
                  (LogicalExpr)
                  NVar1.super_BasicExpr<(mp::expr::Kind)49,_(mp::expr::Kind)49>.super_ExprBase.impl_
                  ,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)
                   then_expr.super_BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1>.super_ExprBase.
                   impl_,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)rhs.impl_);
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (&local_38,(fmt *)0x14e4d3,(CStringRef)&local_50,
             (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)rhs.impl_);
  testing::internal::CmpHelperEQ<char[21],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"if !!(x1 = 0) then 1\"",
             "fmt::format(\"{}\", static_cast<NumericExpr>(MakeIf(MakeNot(MakeNot(MakeRelational(ex::EQ, x, n0))), n1, n0)))"
             ,(char (*) [21])"if !!(x1 = 0) then 1",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_38);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-writer-test.cc"
               ,0x265,message);
    testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_38);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(ExprWriterTest, NotExprPrecedence) {
  NumericExpr n0 = MakeConst(0), n1 = MakeConst(1), x = MakeVariable(0);
  CHECK_WRITE("if !!(x1 = 0) then 1",
      MakeIf(MakeNot(MakeNot(MakeRelational(ex::EQ, x, n0))), n1, n0));
}